

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O2

void av1_highbd_convolve_2d_sr_intrabc_c
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int subpel_y_qn,ConvolveParams *conv_params,int bd)

{
  byte bVar1;
  uint16_t uVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  ulong uVar6;
  int iVar7;
  int16_t *piVar8;
  ulong uVar9;
  uint16_t *local_8b50;
  int16_t im_block [17792];
  
  bVar4 = (byte)conv_params->round_0;
  bVar1 = (byte)conv_params->round_1;
  iVar7 = 0;
  uVar6 = 0;
  if (0 < w) {
    uVar6 = (ulong)(uint)w;
  }
  piVar8 = im_block;
  for (; iVar7 <= h; iVar7 = iVar7 + 1) {
    for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
      piVar8[uVar9] =
           (int16_t)((int)(((uint)src[uVar9 + 1] + (uint)src[uVar9]) * 0x40 +
                          ((1 << (bVar4 & 0x1f)) >> 1) + (1 << ((char)bd + 6U & 0x1f))) >>
                    (bVar4 & 0x1f));
    }
    piVar8 = piVar8 + w;
    src = src + src_stride;
  }
  bVar3 = 0xe - (bVar4 + bVar1);
  bVar4 = ((char)bd - bVar4) + 0xe;
  bVar5 = bVar4 - bVar1;
  iVar7 = 0;
  if (h < 1) {
    h = iVar7;
  }
  piVar8 = im_block;
  local_8b50 = dst;
  for (; iVar7 != h; iVar7 = iVar7 + 1) {
    for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
      uVar2 = clip_pixel_highbd((((int)(piVar8 + w)[uVar9] + (int)piVar8[uVar9]) * 0x40 +
                                 ((1 << (bVar1 & 0x1f)) >> 1) + (1 << (bVar4 & 0x1f)) >>
                                (bVar1 & 0x1f)) +
                                ((1 << (bVar3 & 0x1f)) >> 1) + (-1 << (bVar5 & 0x1f)) +
                                (-1 << (bVar5 - 1 & 0x1f)) >> (bVar3 & 0x1f),bd);
      local_8b50[uVar9] = uVar2;
    }
    local_8b50 = local_8b50 + dst_stride;
    piVar8 = piVar8 + w;
  }
  return;
}

Assistant:

void av1_highbd_convolve_2d_sr_intrabc_c(
    const uint16_t *src, int src_stride, uint16_t *dst, int dst_stride, int w,
    int h, const InterpFilterParams *filter_params_x,
    const InterpFilterParams *filter_params_y, const int subpel_x_qn,
    const int subpel_y_qn, ConvolveParams *conv_params, int bd) {
  const int bits =
      FILTER_BITS * 2 - conv_params->round_0 - conv_params->round_1;
  assert(bits >= 0);
  assert(subpel_x_qn == 8);
  assert(subpel_y_qn == 8);
  assert(filter_params_x->taps == 2 && filter_params_y->taps == 2);
  assert((conv_params->round_0 + conv_params->round_1) == 2 * FILTER_BITS);
  (void)filter_params_x;
  (void)subpel_x_qn;
  (void)filter_params_y;
  (void)subpel_y_qn;
  (void)conv_params;

  int16_t im_block[(MAX_SB_SIZE + MAX_FILTER_TAP - 1) * MAX_SB_SIZE];
  int im_h = h + 1;
  int im_stride = w;
  assert(w <= MAX_SB_SIZE && h <= MAX_SB_SIZE);

  // horizontal filter
  // explicitly operate for subpel_x_qn = 8.
  int16_t *im = im_block;
  for (int y = 0; y < im_h; ++y) {
    for (int x = 0; x < w; ++x) {
      int32_t sum = (1 << (bd + FILTER_BITS - 1)) + 64 * (src[x] + src[x + 1]);
      assert(0 <= sum && sum < (1 << (bd + FILTER_BITS + 1)));
      sum = ROUND_POWER_OF_TWO(sum, conv_params->round_0);
      im[x] = sum;
    }
    src += src_stride;
    im += im_stride;
  }

  // vertical filter
  // explicitly operate for subpel_y_qn = 8.
  int16_t *src_vert = im_block;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      const int32_t sum =
          (1 << offset_bits) + 64 * (src_vert[x] + src_vert[im_stride + x]);
      assert(0 <= sum && sum < (1 << (offset_bits + 2)));
      const int32_t res = ROUND_POWER_OF_TWO(sum, conv_params->round_1) -
                          ((1 << (offset_bits - conv_params->round_1)) +
                           (1 << (offset_bits - conv_params->round_1 - 1)));

      dst[x] = clip_pixel_highbd(ROUND_POWER_OF_TWO(res, bits), bd);
    }
    src_vert += im_stride;
    dst += dst_stride;
  }
}